

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

void __thiscall
cmFindBaseDebugState::cmFindBaseDebugState
          (cmFindBaseDebugState *this,string *commandName,cmFindBase *findBase)

{
  cmFindBase *findBase_local;
  string *commandName_local;
  cmFindBaseDebugState *this_local;
  
  this->FindCommand = findBase;
  std::__cxx11::string::string((string *)&this->CommandName,(string *)commandName);
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::vector(&this->FailedSearchLocations);
  DebugLibState::DebugLibState(&this->FoundSearchLocation);
  return;
}

Assistant:

cmFindBaseDebugState::cmFindBaseDebugState(std::string commandName,
                                           cmFindBase const* findBase)
  : FindCommand(findBase)
  , CommandName(std::move(commandName))
{
}